

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.h
# Opt level: O2

BIT_DStream_status duckdb_zstd::BIT_reloadDStream_internal(BIT_DStream_t *bitD)

{
  uint uVar1;
  char *pcVar2;
  BitContainerType BVar3;
  
  uVar1 = bitD->bitsConsumed;
  pcVar2 = bitD->ptr;
  bitD->ptr = pcVar2 + -(ulong)(uVar1 >> 3);
  bitD->bitsConsumed = uVar1 & 7;
  BVar3 = *(BitContainerType *)(pcVar2 + -(ulong)(uVar1 >> 3));
  bitD->bitContainer = BVar3;
  return (BIT_DStream_status)BVar3;
}

Assistant:

MEM_STATIC BIT_DStream_status BIT_reloadDStream_internal(BIT_DStream_t* bitD)
{
    assert(bitD->bitsConsumed <= sizeof(bitD->bitContainer)*8);
    bitD->ptr -= bitD->bitsConsumed >> 3;
    assert(bitD->ptr >= bitD->start);
    bitD->bitsConsumed &= 7;
    bitD->bitContainer = MEM_readLEST(bitD->ptr);
    return BIT_DStream_unfinished;
}